

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_rdft.cc
# Opt level: O0

void cft1st_128_C(float *a)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float x3i;
  float x3r;
  float x2i;
  float x2r;
  float x1i;
  float x1r;
  float x0i;
  float x0r;
  float wk3i;
  float wk3r;
  float wk2i;
  float wk2r;
  float wk1i;
  float wk1r;
  int k2;
  int k1;
  int j;
  int n;
  float *a_local;
  
  fVar19 = *a;
  fVar20 = a[1];
  fVar23 = *a;
  fVar24 = a[2];
  fVar1 = a[1];
  fVar2 = a[3];
  fVar21 = a[4];
  fVar22 = a[6];
  fVar3 = a[5];
  *a = fVar19 + a[2] + a[4] + a[6];
  a[1] = fVar20 + a[3] + a[5] + a[7];
  a[4] = (fVar19 + a[2]) - (a[4] + a[6]);
  a[5] = (fVar20 + a[3]) - (a[5] + a[7]);
  a[2] = (fVar23 - fVar24) - (fVar3 - a[7]);
  a[3] = (fVar1 - fVar2) + (fVar21 - fVar22);
  a[6] = (fVar23 - fVar24) + (fVar3 - a[7]);
  a[7] = (fVar1 - fVar2) - (fVar21 - fVar22);
  fVar19 = a[8];
  fVar20 = a[9];
  fVar23 = a[8];
  fVar24 = a[10];
  fVar1 = a[9];
  fVar2 = a[0xb];
  fVar21 = a[0xc];
  fVar22 = a[0xc];
  fVar3 = a[0xd];
  a[8] = fVar19 + a[10] + fVar21 + a[0xe];
  a[9] = fVar20 + a[0xb] + a[0xd] + a[0xf];
  a[0xc] = (a[0xd] + a[0xf]) - (fVar20 + a[0xb]);
  a[0xd] = (fVar19 + a[10]) - (fVar21 + a[0xe]);
  fVar19 = (fVar23 - fVar24) - (fVar3 - a[0xf]);
  fVar20 = (fVar1 - fVar2) + (fVar22 - a[0xe]);
  a[10] = (fVar19 - fVar20) * 0.70710677;
  a[0xb] = (fVar19 + fVar20) * 0.70710677;
  fVar19 = (fVar3 - a[0xf]) + (fVar23 - fVar24);
  fVar20 = (fVar22 - a[0xe]) - (fVar1 - fVar2);
  a[0xe] = (fVar20 - fVar19) * 0.70710677;
  a[0xf] = (fVar20 + fVar19) * 0.70710677;
  wk1r = 0.0;
  for (k2 = 0x10; k2 < 0x80; k2 = k2 + 0x10) {
    fVar17 = (float)((int)wk1r + 2);
    iVar18 = (int)fVar17 * 2;
    fVar19 = rdft_w[(int)fVar17];
    fVar20 = rdft_w[(int)wk1r + 3];
    fVar23 = rdft_w[iVar18];
    fVar24 = rdft_w[iVar18 + 1];
    fVar1 = rdft_wk3ri_first[(int)fVar17];
    fVar2 = rdft_wk3ri_first[(int)wk1r + 3];
    fVar21 = a[k2];
    fVar22 = a[k2 + 2];
    fVar3 = a[k2 + 1];
    fVar4 = a[k2 + 3];
    fVar5 = a[k2];
    fVar6 = a[k2 + 2];
    fVar7 = a[k2 + 1];
    fVar8 = a[k2 + 3];
    fVar9 = a[k2 + 4];
    fVar10 = a[k2 + 6];
    fVar11 = a[k2 + 5];
    fVar12 = a[k2 + 7];
    fVar13 = a[k2 + 4];
    fVar14 = a[k2 + 6];
    fVar15 = a[k2 + 5];
    fVar16 = a[k2 + 7];
    a[k2] = fVar21 + fVar22 + fVar9 + fVar10;
    a[k2 + 1] = fVar3 + fVar4 + fVar11 + fVar12;
    fVar21 = (fVar21 + fVar22) - (fVar9 + fVar10);
    fVar22 = (fVar3 + fVar4) - (fVar11 + fVar12);
    a[k2 + 4] = fVar19 * fVar21 + -(fVar20 * fVar22);
    a[k2 + 5] = fVar19 * fVar22 + fVar20 * fVar21;
    fVar21 = (fVar5 - fVar6) - (fVar15 - fVar16);
    fVar22 = (fVar7 - fVar8) + (fVar13 - fVar14);
    a[k2 + 2] = fVar23 * fVar21 + -(fVar24 * fVar22);
    a[k2 + 3] = fVar23 * fVar22 + fVar24 * fVar21;
    fVar23 = (fVar5 - fVar6) + (fVar15 - fVar16);
    fVar24 = (fVar7 - fVar8) - (fVar13 - fVar14);
    a[k2 + 6] = fVar1 * fVar23 + -(fVar2 * fVar24);
    a[k2 + 7] = fVar1 * fVar24 + fVar2 * fVar23;
    fVar23 = rdft_w[iVar18 + 2];
    fVar24 = rdft_w[iVar18 + 3];
    fVar1 = rdft_wk3ri_second[(int)fVar17];
    fVar2 = rdft_wk3ri_second[(int)wk1r + 3];
    fVar21 = a[k2 + 8];
    fVar22 = a[k2 + 10];
    fVar3 = a[k2 + 9];
    fVar4 = a[k2 + 0xb];
    fVar5 = a[k2 + 8];
    fVar6 = a[k2 + 10];
    fVar7 = a[k2 + 9];
    fVar8 = a[k2 + 0xb];
    fVar9 = a[k2 + 0xc];
    fVar10 = a[k2 + 0xe];
    fVar11 = a[k2 + 0xd];
    fVar12 = a[k2 + 0xf];
    fVar13 = a[k2 + 0xc];
    fVar14 = a[k2 + 0xe];
    fVar15 = a[k2 + 0xd];
    fVar16 = a[k2 + 0xf];
    a[k2 + 8] = fVar21 + fVar22 + fVar9 + fVar10;
    a[k2 + 9] = fVar3 + fVar4 + fVar11 + fVar12;
    fVar21 = (fVar21 + fVar22) - (fVar9 + fVar10);
    fVar22 = (fVar3 + fVar4) - (fVar11 + fVar12);
    a[k2 + 0xc] = -fVar20 * fVar21 + -(fVar19 * fVar22);
    a[k2 + 0xd] = -fVar20 * fVar22 + fVar19 * fVar21;
    fVar19 = (fVar5 - fVar6) - (fVar15 - fVar16);
    fVar20 = (fVar7 - fVar8) + (fVar13 - fVar14);
    a[k2 + 10] = fVar23 * fVar19 + -(fVar24 * fVar20);
    a[k2 + 0xb] = fVar23 * fVar20 + fVar24 * fVar19;
    fVar19 = (fVar5 - fVar6) + (fVar15 - fVar16);
    fVar20 = (fVar7 - fVar8) - (fVar13 - fVar14);
    a[k2 + 0xe] = fVar1 * fVar19 + -(fVar2 * fVar20);
    a[k2 + 0xf] = fVar1 * fVar20 + fVar2 * fVar19;
    wk1r = fVar17;
  }
  return;
}

Assistant:

static void cft1st_128_C(float* a) {
  const int n = 128;
  int j, k1, k2;
  float wk1r, wk1i, wk2r, wk2i, wk3r, wk3i;
  float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

  // The processing of the first set of elements was simplified in C to avoid
  // some operations (multiplication by zero or one, addition of two elements
  // multiplied by the same weight, ...).
  x0r = a[0] + a[2];
  x0i = a[1] + a[3];
  x1r = a[0] - a[2];
  x1i = a[1] - a[3];
  x2r = a[4] + a[6];
  x2i = a[5] + a[7];
  x3r = a[4] - a[6];
  x3i = a[5] - a[7];
  a[0] = x0r + x2r;
  a[1] = x0i + x2i;
  a[4] = x0r - x2r;
  a[5] = x0i - x2i;
  a[2] = x1r - x3i;
  a[3] = x1i + x3r;
  a[6] = x1r + x3i;
  a[7] = x1i - x3r;
  wk1r = rdft_w[2];
  x0r = a[8] + a[10];
  x0i = a[9] + a[11];
  x1r = a[8] - a[10];
  x1i = a[9] - a[11];
  x2r = a[12] + a[14];
  x2i = a[13] + a[15];
  x3r = a[12] - a[14];
  x3i = a[13] - a[15];
  a[8] = x0r + x2r;
  a[9] = x0i + x2i;
  a[12] = x2i - x0i;
  a[13] = x0r - x2r;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  a[10] = wk1r * (x0r - x0i);
  a[11] = wk1r * (x0r + x0i);
  x0r = x3i + x1r;
  x0i = x3r - x1i;
  a[14] = wk1r * (x0i - x0r);
  a[15] = wk1r * (x0i + x0r);
  k1 = 0;
  for (j = 16; j < n; j += 16) {
    k1 += 2;
    k2 = 2 * k1;
    wk2r = rdft_w[k1 + 0];
    wk2i = rdft_w[k1 + 1];
    wk1r = rdft_w[k2 + 0];
    wk1i = rdft_w[k2 + 1];
    wk3r = rdft_wk3ri_first[k1 + 0];
    wk3i = rdft_wk3ri_first[k1 + 1];
    x0r = a[j + 0] + a[j + 2];
    x0i = a[j + 1] + a[j + 3];
    x1r = a[j + 0] - a[j + 2];
    x1i = a[j + 1] - a[j + 3];
    x2r = a[j + 4] + a[j + 6];
    x2i = a[j + 5] + a[j + 7];
    x3r = a[j + 4] - a[j + 6];
    x3i = a[j + 5] - a[j + 7];
    a[j + 0] = x0r + x2r;
    a[j + 1] = x0i + x2i;
    x0r -= x2r;
    x0i -= x2i;
    a[j + 4] = wk2r * x0r - wk2i * x0i;
    a[j + 5] = wk2r * x0i + wk2i * x0r;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j + 2] = wk1r * x0r - wk1i * x0i;
    a[j + 3] = wk1r * x0i + wk1i * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j + 6] = wk3r * x0r - wk3i * x0i;
    a[j + 7] = wk3r * x0i + wk3i * x0r;
    wk1r = rdft_w[k2 + 2];
    wk1i = rdft_w[k2 + 3];
    wk3r = rdft_wk3ri_second[k1 + 0];
    wk3i = rdft_wk3ri_second[k1 + 1];
    x0r = a[j + 8] + a[j + 10];
    x0i = a[j + 9] + a[j + 11];
    x1r = a[j + 8] - a[j + 10];
    x1i = a[j + 9] - a[j + 11];
    x2r = a[j + 12] + a[j + 14];
    x2i = a[j + 13] + a[j + 15];
    x3r = a[j + 12] - a[j + 14];
    x3i = a[j + 13] - a[j + 15];
    a[j + 8] = x0r + x2r;
    a[j + 9] = x0i + x2i;
    x0r -= x2r;
    x0i -= x2i;
    a[j + 12] = -wk2i * x0r - wk2r * x0i;
    a[j + 13] = -wk2i * x0i + wk2r * x0r;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j + 10] = wk1r * x0r - wk1i * x0i;
    a[j + 11] = wk1r * x0i + wk1i * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j + 14] = wk3r * x0r - wk3i * x0i;
    a[j + 15] = wk3r * x0i + wk3i * x0r;
  }
}